

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O3

void __thiscall
testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::Matcher
          (Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this,StringView s
          )

{
  MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&> local_80;
  long *local_68;
  long local_60;
  long local_58 [2];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).vtable_ =
       (VTable *)0x0;
  (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0014a7c8;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,s._M_str,s._M_str + s._M_len);
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_68,local_60 + (long)local_68);
  local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0014ab30;
  local_80.vtable_ =
       (VTable *)
       internal::MatcherBase<std::basic_string_view<char,std::char_traits<char>>const&>::
       GetVTable<testing::internal::MatcherBase<std::basic_string_view<char,std::char_traits<char>>const&>::ValuePolicy<testing::internal::EqMatcher<std::__cxx11::string>,false>>()
       ::kVTable;
  local_80.buffer_.ptr = operator_new(0x28);
  ((local_80.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(undefined8 **)(local_80.buffer_.i + 8) = (undefined8 *)(local_80.buffer_.i + 0x18);
  if (local_48 == &local_38) {
    *(undefined8 *)(local_80.buffer_.i + 0x18) = CONCAT71(uStack_37,local_38);
    *(undefined8 *)(local_80.buffer_.i + 0x20) = uStack_30;
  }
  else {
    *(undefined1 **)(local_80.buffer_.i + 8) = local_48;
    *(ulong *)(local_80.buffer_.i + 0x18) = CONCAT71(uStack_37,local_38);
  }
  *(undefined8 *)(local_80.buffer_.i + 0x10) = local_40;
  local_40 = 0;
  local_38 = 0;
  local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0014a7c8;
  local_48 = &local_38;
  internal::MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::operator=
            (&this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>
             ,&local_80);
  internal::MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::~MatcherBase
            (&local_80);
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return;
}

Assistant:

Matcher<const internal::StringView&>::Matcher(internal::StringView s) {
  *this = Eq(std::string(s));
}